

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O2

string * efsw::Platform::findDevicePath(string *__return_storage_ptr__,string *directory)

{
  __type _Var1;
  long lVar2;
  undefined8 *puVar3;
  string dirName;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = setmntent("/proc/mounts","r");
  if (lVar2 != 0) {
    while (puVar3 = (undefined8 *)getmntent(lVar2), puVar3 != (undefined8 *)0x0) {
      std::__cxx11::string::string((string *)&local_50,(char *)puVar3[1],&local_51);
      _Var1 = std::operator==(&local_50,directory);
      if (_Var1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)*puVar3,&local_51);
        endmntent(lVar2);
        std::__cxx11::string::~string((string *)&local_50);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    endmntent(lVar2);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string findDevicePath( const std::string& directory ) {
	struct mntent* ent;
	FILE* aFile;

	aFile = setmntent( "/proc/mounts", "r" );

	if ( aFile == NULL )
		return "";

	while ( NULL != ( ent = getmntent( aFile ) ) ) {
		std::string dirName( ent->mnt_dir );

		if ( dirName == directory ) {
			std::string fsName( ent->mnt_fsname );

			endmntent( aFile );

			return fsName;
		}
	}

	endmntent( aFile );

	return "";
}